

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O2

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  cmState *this_00;
  cmGlobalGenerator *pcVar10;
  long lVar11;
  ostream *poVar12;
  cmTarget *pcVar13;
  TargetType TVar14;
  string *psVar15;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  first;
  string libType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",(allocator<char> *)&libType)
    ;
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_001c3030;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"BUILD_SHARED_LIBS",(allocator<char> *)&libType);
  pcVar9 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  bVar3 = cmSystemTools::IsOff(pcVar9);
  std::__cxx11::string::~string((string *)&e);
  TVar14 = SHARED_LIBRARY - bVar3;
  psVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar7 = false;
  bVar2 = false;
  bVar5 = false;
  bVar6 = false;
  bVar3 = false;
  first._M_current = psVar15;
  while (first._M_current = first._M_current + 1,
        first._M_current !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&libType,(string *)first._M_current);
    bVar4 = std::operator==(&libType,"STATIC");
    if (bVar4) {
      bVar5 = true;
      bVar4 = TVar14 != INTERFACE_LIBRARY;
      TVar14 = STATIC_LIBRARY;
      if (bVar4) goto LAB_001c2ffc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting STATIC type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
LAB_001c32b9:
      std::__cxx11::string::~string((string *)&srclists);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      psVar15 = &libType;
      goto LAB_001c32d2;
    }
    bVar4 = std::operator==(&libType,"SHARED");
    if (bVar4) {
      bVar5 = true;
      bVar4 = TVar14 != INTERFACE_LIBRARY;
      TVar14 = SHARED_LIBRARY;
      if (bVar4) goto LAB_001c2ffc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting SHARED type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_001c32b9;
    }
    bVar4 = std::operator==(&libType,"MODULE");
    if (bVar4) {
      bVar5 = true;
      bVar4 = TVar14 != INTERFACE_LIBRARY;
      TVar14 = MODULE_LIBRARY;
      if (bVar4) goto LAB_001c2ffc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting MODULE type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_001c32b9;
    }
    bVar4 = std::operator==(&libType,"OBJECT");
    if (bVar4) {
      bVar5 = true;
      bVar4 = TVar14 != INTERFACE_LIBRARY;
      TVar14 = OBJECT_LIBRARY;
      if (bVar4) goto LAB_001c2ffc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting OBJECT type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_001c32b9;
    }
    bVar4 = std::operator==(&libType,"UNKNOWN");
    if (bVar4) {
      bVar5 = true;
      bVar4 = TVar14 != INTERFACE_LIBRARY;
      TVar14 = UNKNOWN_LIBRARY;
      if (bVar4) goto LAB_001c2ffc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting UNKNOWN type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_001c32b9;
    }
    bVar4 = std::operator==(&libType,"ALIAS");
    if (bVar4) {
      bVar6 = true;
      if (TVar14 != INTERFACE_LIBRARY) goto LAB_001c2ffc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting ALIAS type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_001c32b9;
    }
    bVar4 = std::operator==(&libType,"INTERFACE");
    if (bVar4) {
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting/multiple types."
                       );
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      }
      else if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting ALIAS type.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      }
      else {
        bVar5 = true;
        TVar14 = INTERFACE_LIBRARY;
        if (!bVar3) goto LAB_001c2ffc;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      }
      goto LAB_001c32b9;
    }
    bVar4 = std::operator==(first._M_current,"EXCLUDE_FROM_ALL");
    if (bVar4) {
      bVar3 = true;
      if (TVar14 == INTERFACE_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
        goto LAB_001c32b9;
      }
    }
    else {
      bVar4 = std::operator==(first._M_current,"IMPORTED");
      if (bVar4) {
        bVar2 = true;
      }
      else {
        if ((!bVar2) || (bVar4 = std::operator==(first._M_current,"GLOBAL"), !bVar4)) {
          if ((TVar14 == INTERFACE_LIBRARY) &&
             (bVar4 = std::operator==(first._M_current,"GLOBAL"), bVar4)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            std::operator<<((ostream *)&e,"GLOBAL option may only be used with IMPORTED libraries.")
            ;
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
            goto LAB_001c32b9;
          }
          std::__cxx11::string::~string((string *)&libType);
          break;
        }
        bVar7 = true;
      }
    }
LAB_001c2ffc:
    std::__cxx11::string::~string((string *)&libType);
  }
  if (TVar14 == INTERFACE_LIBRARY) {
    if (first._M_current !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library requires no source arguments.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&libType);
      goto LAB_001c3399;
    }
    if ((bVar7) && (!bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified as GLOBAL, but not as IMPORTED.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&libType);
      goto LAB_001c3399;
    }
  }
  bVar4 = cmGeneratorExpression::IsValidTargetName(psVar15);
  if ((((!bVar4) || (bVar4 = cmGlobalGenerator::IsReservedTarget(psVar15), bVar4)) ||
      ((!bVar2 &&
       ((!bVar6 && (lVar11 = std::__cxx11::string::find((char)psVar15,0x3a), lVar11 != -1)))))) &&
     (bVar4 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,psVar15,TVar14), !bVar4)) {
    return false;
  }
  if (bVar6) {
    bVar5 = cmGeneratorExpression::IsValidTargetName(psVar15);
    if (bVar5) {
      if (bVar3 != false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                   (allocator<char> *)&libType);
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
        goto LAB_001c3030;
      }
      if ((bVar2) || (bVar7 != false)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"IMPORTED with ALIAS is not allowed.",(allocator<char> *)&libType);
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
        goto LAB_001c3030;
      }
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x60) {
        bVar3 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,first._M_current);
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar12 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
          poVar12 = std::operator<<(poVar12,(string *)psVar15);
          poVar12 = std::operator<<(poVar12,"\" because target \"");
          poVar12 = std::operator<<(poVar12,(string *)first._M_current);
          std::operator<<(poVar12,"\" is itself an ALIAS.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&libType);
        }
        else {
          pcVar13 = cmMakefile::FindTargetToUse
                              ((this->super_cmCommand).Makefile,first._M_current,true);
          if (pcVar13 == (cmTarget *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar12 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
            poVar12 = std::operator<<(poVar12,(string *)psVar15);
            poVar12 = std::operator<<(poVar12,"\" because target \"");
            poVar12 = std::operator<<(poVar12,(string *)first._M_current);
            std::operator<<(poVar12,"\" does not already exist.");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&libType);
          }
          else {
            TVar14 = cmTarget::GetType(pcVar13);
            if (((TVar14 - STATIC_LIBRARY < 4) || (TVar14 == INTERFACE_LIBRARY)) ||
               ((TVar14 == UNKNOWN_LIBRARY && (bVar3 = cmTarget::IsImported(pcVar13), bVar3)))) {
              bVar3 = cmTarget::IsImported(pcVar13);
              if ((!bVar3) || (bVar3 = cmTarget::IsImportedGloballyVisible(pcVar13), bVar3)) {
                cmMakefile::AddAlias((this->super_cmCommand).Makefile,psVar15,first._M_current);
                return true;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar12 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
              poVar12 = std::operator<<(poVar12,(string *)psVar15);
              poVar12 = std::operator<<(poVar12,"\" because target \"");
              poVar12 = std::operator<<(poVar12,(string *)first._M_current);
              std::operator<<(poVar12,"\" is imported but not globally visible.");
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&libType);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar12 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
              poVar12 = std::operator<<(poVar12,(string *)psVar15);
              poVar12 = std::operator<<(poVar12,"\" because target \"");
              poVar12 = std::operator<<(poVar12,(string *)first._M_current);
              std::operator<<(poVar12,"\" is not a library.");
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&libType);
            }
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"ALIAS requires exactly one target argument.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&libType);
      }
      goto LAB_001c3399;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   "Invalid name for ALIAS: ",psVar15);
    cmCommand::SetError(&this->super_cmCommand,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
    goto LAB_001c3030;
  }
  if ((bVar2) && (bVar3 != false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"excludeFromAll with IMPORTED target makes no sense.",
               (allocator<char> *)&libType);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_001c3030;
  }
  if ((TVar14 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"TARGET_SUPPORTS_SHARED_LIBS",(allocator<char> *)&libType);
    bVar6 = cmState::GetGlobalPropertyAsBool(this_00,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (bVar6) goto LAB_001c34ec;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar12 = std::operator<<((ostream *)&e,"ADD_LIBRARY called with ");
    pcVar9 = "MODULE";
    if (TVar14 == SHARED_LIBRARY) {
      pcVar9 = "SHARED";
    }
    poVar12 = std::operator<<(poVar12,pcVar9);
    std::operator<<(poVar12,
                    " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                   );
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&libType);
    std::__cxx11::string::~string((string *)&libType);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    TVar14 = STATIC_LIBRARY;
    if (bVar2) goto LAB_001c365f;
  }
  else {
LAB_001c34ec:
    if (bVar2) {
LAB_001c365f:
      if (bVar5) {
        if (TVar14 == INTERFACE_LIBRARY) {
          bVar3 = cmGeneratorExpression::IsValidTargetName(psVar15);
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar12 = std::operator<<((ostream *)&e,
                                      "Invalid name for IMPORTED INTERFACE library target: ");
            std::operator<<(poVar12,(string *)psVar15);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&libType);
            goto LAB_001c3399;
          }
        }
        else if (TVar14 == OBJECT_LIBRARY) {
          _e = (pointer)local_198;
          local_198[0]._M_local_buf[0] = '\0';
          pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          iVar8 = (*pcVar10->_vptr_cmGlobalGenerator[0x25])(pcVar10,&e);
          if ((char)iVar8 == '\0') {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srclists,
                           "The OBJECT library type may not be used for IMPORTED libraries",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
            std::operator+(&libType,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&srclists,".");
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&libType);
            std::__cxx11::string::~string((string *)&libType);
            std::__cxx11::string::~string((string *)&srclists);
LAB_001c352a:
            std::__cxx11::string::~string((string *)&e);
            return true;
          }
          std::__cxx11::string::~string((string *)&e);
        }
        pcVar13 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,psVar15,false);
        if (pcVar13 == (cmTarget *)0x0) {
          cmMakefile::AddImportedTarget((this->super_cmCommand).Makefile,psVar15,TVar14,bVar7);
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar12 = std::operator<<((ostream *)&e,"cannot create imported target \"");
        poVar12 = std::operator<<(poVar12,(string *)psVar15);
        std::operator<<(poVar12,"\" because another target with the same name already exists.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&libType);
LAB_001c3399:
        std::__cxx11::string::~string((string *)&libType);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        return false;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"called with IMPORTED argument but no library type.",
                 (allocator<char> *)&libType);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_001c3030;
    }
    if (TVar14 == UNKNOWN_LIBRARY) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"The UNKNOWN library type may be used only for IMPORTED libraries.",
                 (allocator<char> *)&libType);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
      goto LAB_001c352a;
    }
  }
  _e = (pointer)local_198;
  local_198[0]._M_local_buf[0] = '\0';
  bVar7 = cmMakefile::EnforceUniqueName((this->super_cmCommand).Makefile,psVar15,(string *)&e,false)
  ;
  if (!bVar7) {
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
LAB_001c3030:
    psVar15 = (string *)&e;
LAB_001c32d2:
    std::__cxx11::string::~string((string *)psVar15);
    return false;
  }
  std::__cxx11::string::~string((string *)&e);
  srclists.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srclists.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  srclists.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (TVar14 == INTERFACE_LIBRARY) {
    bVar7 = cmGeneratorExpression::IsValidTargetName(psVar15);
    if ((!bVar7) || (lVar11 = std::__cxx11::string::find((char *)psVar15,0x469fba), lVar11 != -1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar12 = std::operator<<((ostream *)&e,"Invalid name for INTERFACE library target: ");
      std::operator<<(poVar12,(string *)psVar15);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&libType);
      std::__cxx11::string::~string((string *)&libType);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar7 = false;
      goto LAB_001c3924;
    }
    TVar14 = INTERFACE_LIBRARY;
  }
  else {
    cmAppend<std::__cxx11::string,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&srclists,first,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar7 = true;
  cmMakefile::AddLibrary((this->super_cmCommand).Makefile,psVar15,TVar14,&srclists,bVar3);
LAB_001c3924:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&srclists);
  return bVar7;
}

Assistant:

bool cmAddLibraryCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(
        this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
      }
      if (isAlias) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      if (excludeFromAll) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
    } else {
      break;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (s != args.end()) {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
    }
    if (importGlobal && !importTarget) {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !this->Makefile->CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName
        << "\" does not already "
           "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY &&
        !(aliasedType == cmStateEnums::UNKNOWN_LIBRARY &&
          aliasedTarget->IsImported())) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
  }

  if (importTarget && excludeFromAll) {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !this->Makefile->GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    std::ostringstream w;
    w << "ADD_LIBRARY called with "
      << (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE")
      << " option but the target platform does not support dynamic linking. "
         "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::OBJECT_LIBRARY) {
      std::string reason;
      if (!this->Makefile->GetGlobalGenerator()->HasKnownObjectFileLocation(
            &reason)) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The OBJECT library type may not be used for IMPORTED libraries" +
            reason + ".");
        return true;
      }
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(libName)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(libName, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists;

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
    }

    this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);
    return true;
  }

  cmAppend(srclists, s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}